

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-canvas.c
# Opt level: O2

float plutovg_canvas_text_extents
                (plutovg_canvas_t *canvas,void *text,int length,plutovg_text_encoding_t encoding,
                plutovg_rect_t *extents)

{
  float size;
  undefined4 uVar1;
  ulong uVar2;
  undefined4 uVar3;
  plutovg_font_face_t *face;
  plutovg_codepoint_t codepoint;
  plutovg_rect_t *ppVar4;
  float fVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  float fStack_5c;
  plutovg_rect_t pStack_58;
  plutovg_text_iterator_t pStack_48;
  
  face = canvas->state->font_face;
  if ((face != (plutovg_font_face_t *)0x0) && (size = canvas->state->font_size, 0.0 < size)) {
    plutovg_text_iterator_init(&pStack_48,text,length,encoding);
    fVar5 = 0.0;
    ppVar4 = (plutovg_rect_t *)0x0;
    while (pStack_48.index < pStack_48.length) {
      codepoint = plutovg_text_iterator_next(&pStack_48);
      if (extents == (plutovg_rect_t *)0x0) {
        plutovg_font_face_get_glyph_metrics
                  (face,size,codepoint,&fStack_5c,(float *)0x0,(plutovg_rect_t *)0x0);
      }
      else {
        plutovg_font_face_get_glyph_metrics(face,size,codepoint,&fStack_5c,(float *)0x0,&pStack_58);
        pStack_58.x = pStack_58.x + fVar5;
        if (ppVar4 == (plutovg_rect_t *)0x0) {
          extents->x = pStack_58.x;
          extents->y = pStack_58.y;
          extents->w = pStack_58.w;
          extents->h = pStack_58.h;
          ppVar4 = extents;
        }
        else {
          uVar2._0_4_ = ppVar4->x;
          uVar2._4_4_ = ppVar4->y;
          auVar6._8_8_ = 0;
          auVar6._0_8_ = uVar2;
          uVar1 = ppVar4->w;
          uVar3 = ppVar4->h;
          auVar8._0_4_ = (float)uVar1 + (float)(undefined4)uVar2;
          auVar8._4_4_ = (float)uVar3 + (float)uVar2._4_4_;
          auVar8._8_8_ = 0;
          auVar7._4_4_ = pStack_58.y;
          auVar7._0_4_ = pStack_58.x;
          auVar7._8_8_ = 0;
          auVar7 = minps(auVar6,auVar7);
          auVar9._4_4_ = pStack_58.h + pStack_58.y;
          auVar9._0_4_ = pStack_58.w + pStack_58.x;
          auVar9._8_8_ = 0;
          auVar9 = maxps(auVar8,auVar9);
          ppVar4->x = (float)(int)auVar7._0_8_;
          ppVar4->y = (float)(int)(auVar7._0_8_ >> 0x20);
          ppVar4->w = auVar9._0_4_ - auVar7._0_4_;
          ppVar4->h = auVar9._4_4_ - auVar7._4_4_;
        }
      }
      fVar5 = fVar5 + fStack_5c;
    }
    if (ppVar4 == (plutovg_rect_t *)0x0 && extents != (plutovg_rect_t *)0x0) {
      extents->x = 0.0;
      extents->y = 0.0;
      extents->w = 0.0;
      extents->h = 0.0;
    }
    return fVar5;
  }
  if (extents != (plutovg_rect_t *)0x0) {
    extents->x = 0.0;
    extents->y = 0.0;
    extents->w = 0.0;
    extents->h = 0.0;
  }
  return 0.0;
}

Assistant:

float plutovg_canvas_text_extents(plutovg_canvas_t* canvas, const void* text, int length, plutovg_text_encoding_t encoding, plutovg_rect_t* extents)
{
    plutovg_state_t* state = canvas->state;
    if(state->font_face && state->font_size > 0.f) {
        return plutovg_font_face_text_extents(state->font_face, state->font_size, text, length, encoding, extents);
    }

    if(extents) {
        extents->x = 0.f;
        extents->y = 0.f;
        extents->w = 0.f;
        extents->h = 0.f;
    }

    return 0.f;
}